

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

void digactualhole(int x,int y,monst *madeby,int ttyp)

{
  undefined1 *puVar1;
  monst *pmVar2;
  obj *poVar3;
  obj *poVar4;
  permonst *ppVar5;
  uint3 uVar6;
  level *plVar7;
  boolean bVar8;
  xchar xVar9;
  schar sVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  trap *ptVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  schar *psVar19;
  long lVar20;
  monst *mtmp;
  long lVar21;
  xchar x_00;
  bool bVar22;
  char cVar23;
  int by;
  char surface_type [256];
  undefined4 local_15c;
  int local_158;
  uint local_154;
  long local_150;
  long local_148;
  int local_13c;
  int local_138;
  undefined2 local_134;
  
  plVar7 = level;
  lVar21 = (long)x;
  lVar20 = (long)y;
  pmVar2 = level->monsters[lVar21][lVar20];
  if (pmVar2 == (monst *)0x0) {
    mtmp = (monst *)0x0;
  }
  else {
    mtmp = (monst *)0x0;
    if ((pmVar2->field_0x61 & 2) == 0) {
      mtmp = pmVar2;
    }
  }
  uVar16 = u.uy ^ y | u.ux ^ x;
  uVar6 = (uint3)(uVar16 >> 8);
  uVar17 = (uint)CONCAT71((uint7)uVar6,1);
  if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
       ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 1) == 0)) {
    if (u.usteed == (monst *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = CONCAT31(uVar6,(char)(u.usteed)->data->mflags1) & 0xffffff01;
    }
  }
  if ((u.utrap != 0) && (u.utraptype == 4)) {
    u.utrap = 0;
  }
  cVar23 = level->locations[lVar21][lVar20].typ;
  local_148 = lVar20;
  local_13c = ttyp;
  if (cVar23 == '$') {
LAB_00164c12:
    local_15c = y;
    local_138 = x;
    find_drawbridge(&local_138,&local_15c);
    destroy_drawbridge(local_138,local_15c);
    return;
  }
  if (cVar23 == '\x1f') {
    breaksink(x,y);
    return;
  }
  x_00 = (xchar)x;
  xVar9 = (xchar)y;
  if (cVar23 == '\x1c') {
    dogushforth(0);
    puVar1 = &level->locations[lVar21][lVar20].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x20;
    dryup(x_00,xVar9,madeby == &youmonst);
    return;
  }
  local_154 = uVar17;
  local_150 = lVar21;
  iVar11 = is_drawbridge_wall(x,y);
  iVar12 = local_13c;
  if (-1 < iVar11) goto LAB_00164c12;
  psVar19 = &plVar7->locations[lVar21][lVar20].typ;
  local_158 = 0xb;
  if (local_13c != 0xb) {
    bVar8 = can_dig_down(level);
    if (bVar8 == '\0') {
      impossible("digactualhole: can\'t dig %s on this level.",defexplain[(long)iVar12 + 0x2f]);
    }
    else {
      local_158 = iVar12;
    }
  }
  if (*psVar19 == ' ') {
    local_134 = 0x65;
    local_138 = 0x76617267;
  }
  else {
    pcVar13 = surface(x,y);
    strcpy((char *)&local_138,pcVar13);
  }
  if (*psVar19 == '\x17') {
    pcVar13 = in_rooms(level,x_00,xVar9,0x12);
    bVar22 = *pcVar13 != '\0';
  }
  else {
    bVar22 = false;
  }
  poVar3 = level->objects[lVar21][local_148];
  ptVar14 = maketrap(level,x,y,local_158);
  if (ptVar14 == (trap *)0x0) {
    return;
  }
  if (madeby == &youmonst) {
    bVar15 = 0xa0;
  }
  else {
    bVar15 = (viz_array[local_148][local_150] & 2U) << 4;
  }
  poVar4 = level->objects[lVar21][local_148];
  ptVar14->field_0x8 = ptVar14->field_0x8 & 0x5f | bVar15;
  newsym((int)ptVar14->tx,(int)ptVar14->ty);
  if (local_158 == 0xb) {
    if (madeby == &youmonst) {
      pline("You dig a pit in the %s.",&local_138);
      if (bVar22) {
        pay_for_damage("ruin",'\0');
      }
      goto LAB_00165095;
    }
    if (madeby != (monst *)0x0) {
      if (madeby->wormno == '\0') {
        if (((viz_array[madeby->my][madeby->mx] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
              (((youmonst.data)->mflags3 & 0x100) != 0)) &&
             (((viz_array[madeby->my][madeby->mx] & 1U) != 0 &&
              ((madeby->data->mflags3 & 0x200) != 0)))))))) goto LAB_00164fe2;
      }
      else {
        bVar8 = worm_known(level,madeby);
        if (bVar8 != '\0') {
LAB_00164fe2:
          uVar17 = *(uint *)&madeby->field_0x60;
          if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar17 & 0x280) == 0) goto LAB_00165021;
          }
          else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00165021:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar13 = Monnam(madeby);
              pline("%s digs a pit in the %s.",pcVar13,&local_138);
              goto LAB_00165095;
            }
          }
        }
      }
    }
    if (((viz_array[local_148][local_150] & 2U) != 0) && (flags.verbose != '\0')) {
      pline("A pit appears in the %s.",&local_138);
    }
LAB_00165095:
    if (uVar16 == 0) {
      if ((char)local_154 == '\0') {
        if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
           (((youmonst.data)->mflags1 & 8) == 0)) {
          uVar16 = mt_random();
          u.utrap = (uVar16 & 3) + 2;
        }
        u.utraptype = 1;
        vision_full_recalc = '\x01';
      }
      else {
        u.utrap = 0;
      }
      if (poVar3 == poVar4) {
        return;
      }
      pickup(1);
      return;
    }
    if (mtmp == (monst *)0x0) {
      return;
    }
    ppVar5 = mtmp->data;
    if (((ppVar5->mflags1 & 1) == 0) && (ppVar5->mlet != '\x05')) {
      if (mtmp == madeby) {
        return;
      }
      mintrap(mtmp);
      return;
    }
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          if (ublindf == (obj *)0x0) {
            return;
          }
          if (ublindf->oartifact != '\x1d') {
            return;
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return;
        }
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          return;
        }
        if ((ppVar5->mflags3 & 0x200) == 0) {
          return;
        }
      }
    }
    else {
      bVar8 = worm_known(level,mtmp);
      if (bVar8 == '\0') {
        return;
      }
    }
    uVar16 = *(uint *)&mtmp->field_0x60;
    if ((((uVar16 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar16 & 0x280) != 0) {
        return;
      }
    }
    else {
      if ((uVar16 & 0x280) != 0) {
        return;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return;
    }
    pcVar13 = Monnam(mtmp);
    pcVar18 = "flies";
    if ((mtmp->data->mflags1 & 1) == 0) {
      pcVar18 = "floats";
    }
    pline("%s %s over the pit.",pcVar13,pcVar18);
    return;
  }
  if (madeby == &youmonst) {
    pline("You dig a hole through the %s.",&local_138);
    goto LAB_001652d4;
  }
  if (madeby != (monst *)0x0) {
    if (madeby->wormno == '\0') {
      if (((viz_array[madeby->my][madeby->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          (((viz_array[madeby->my][madeby->mx] & 1U) != 0 && ((madeby->data->mflags3 & 0x200) != 0))
          )))) goto LAB_0016521c;
    }
    else {
      bVar8 = worm_known(level,madeby);
      if (bVar8 != '\0') {
LAB_0016521c:
        uVar17 = *(uint *)&madeby->field_0x60;
        if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar17 & 0x280) == 0) goto LAB_0016525a;
        }
        else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0016525a:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar13 = Monnam(madeby);
            pline("%s digs a hole through the %s.",pcVar13,&local_138);
            goto LAB_001652d4;
          }
        }
      }
    }
  }
  if (((viz_array[local_148][local_150] & 2U) != 0) && (flags.verbose != '\0')) {
    pline("A hole appears in the %s.",&local_138);
  }
LAB_001652d4:
  if (uVar16 == 0) {
    cVar23 = (char)local_154;
    if ((u.ustuck == (monst *)0x0) && (cVar23 == '\0')) {
      bVar8 = next_to_u();
      cVar23 = bVar8 == '\0';
      if ((bool)cVar23) {
        pline("You are jerked back by your pet!");
      }
    }
    if ((u.ustuck == (monst *)0x0) && (cVar23 == '\0')) {
      if ((madeby == &youmonst) && (u.ushops[0] != '\0')) {
        shopdig(1);
      }
      else if (madeby != &youmonst) {
        pay_for_damage("dig into",'\x01');
      }
      pline("You fall through...");
      local_15c._0_2_ = (d_level)CONCAT11(u.uz.dlevel + '\x01',u.uz.dnum);
      goto_level((d_level *)&local_15c,'\0','\x01','\0');
      spoteffects('\0');
      return;
    }
    if (poVar4 != (obj *)0x0) {
      impact_drop((obj *)0x0,x_00,xVar9,'\0');
    }
    if (poVar3 != poVar4) {
      pickup(1);
    }
    if (!bVar22 || madeby != &youmonst) {
      return;
    }
    pay_for_damage("ruin",'\0');
    return;
  }
  if (bVar22 && madeby == &youmonst) {
    pay_for_damage("ruin",'\0');
  }
  if (poVar4 != (obj *)0x0) {
    impact_drop((obj *)0x0,x_00,xVar9,'\0');
  }
  if (mtmp == (monst *)0x0) {
    return;
  }
  ppVar5 = mtmp->data;
  if ((ppVar5->mflags1 & 1) != 0) {
    return;
  }
  if (ppVar5 == mons + 0x56 || ppVar5->mlet == '\x05') {
    return;
  }
  if ((mtmp->wormno != '\0') && (iVar12 = count_wsegs(mtmp), 5 < iVar12)) {
    return;
  }
  if (3 < mtmp->data->msize) {
    return;
  }
  if (mtmp == u.ustuck) {
    return;
  }
  bVar8 = teleport_pet(mtmp,'\0');
  if (bVar8 == '\0') {
    return;
  }
  bVar8 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
  if (bVar8 == '\0') {
    bVar8 = Is_botlevel(&u.uz);
    if (bVar8 != '\0') {
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if ((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
            if (ublindf == (obj *)0x0) {
              return;
            }
            if (ublindf->oartifact != '\x1d') {
              return;
            }
          }
          if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) {
            return;
          }
          if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
            return;
          }
          if ((mtmp->data->mflags3 & 0x200) == 0) {
            return;
          }
        }
      }
      else {
        bVar8 = worm_known(level,mtmp);
        if (bVar8 == '\0') {
          return;
        }
      }
      uVar16 = *(uint *)&mtmp->field_0x60;
      if ((((uVar16 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar16 & 0x280) != 0) {
          return;
        }
      }
      else {
        if ((uVar16 & 0x280) != 0) {
          return;
        }
        if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
          return;
        }
      }
      if ((u._1052_1_ & 0x20) != 0) {
        return;
      }
      pcVar13 = Monnam(mtmp);
      pline("%s avoids the trap.",pcVar13);
      return;
    }
    sVar10 = depth(&u.uz);
    get_level((d_level *)&local_15c,sVar10 + 1);
  }
  else {
    assign_level((d_level *)&local_15c,&dungeon_topology.d_valley_level);
  }
  if ((mtmp->field_0x63 & 2) != 0) {
    make_angry_shk(mtmp,'\0','\0');
  }
  xVar9 = ledger_no((d_level *)&local_15c);
  migrate_to_level(mtmp,xVar9,'\0',(coord *)0x0);
  return;
}

Assistant:

void digactualhole(int x, int y, struct monst *madeby, int ttyp)
{
	struct obj *oldobjs, *newobjs;
	struct trap *ttmp;
	char surface_type[BUFSZ];
	struct rm *loc = &level->locations[x][y];
	boolean shopdoor;
	struct monst *mtmp = m_at(level, x, y);	/* may be madeby */
	boolean madeby_u = (madeby == BY_YOU);
	boolean madeby_obj = (madeby == BY_OBJECT);
	boolean at_u = (x == u.ux) && (y == u.uy);
	boolean wont_fall = Levitation || Flying;

	if (u.utrap && u.utraptype == TT_INFLOOR) u.utrap = 0;

	/* these furniture checks were in dighole(), but wand
	   breaking bypasses that routine and calls us directly */
	if (IS_FOUNTAIN(loc->typ)) {
	    dogushforth(FALSE);
	    SET_FOUNTAIN_WARNED(x,y);		/* force dryup */
	    dryup(x, y, madeby_u);
	    return;
	} else if (IS_SINK(loc->typ)) {
	    breaksink(x, y);
	    return;
	} else if (loc->typ == DRAWBRIDGE_DOWN ||
		   (is_drawbridge_wall(x, y) >= 0)) {
	    int bx = x, by = y;
	    /* if under the portcullis, the bridge is adjacent */
	    find_drawbridge(&bx, &by);
	    destroy_drawbridge(bx, by);
	    return;
	}

	if (ttyp != PIT && !can_dig_down(level)) {
	    impossible("digactualhole: can't dig %s on this level.",
		       trapexplain[ttyp-1]);
	    ttyp = PIT;
	}

	/* maketrap(level, ) might change it, also, in this situation,
	   surface() returns an inappropriate string for a grave */
	if (IS_GRAVE(loc->typ))
	    strcpy(surface_type, "grave");
	else
	    strcpy(surface_type, surface(x,y));
	shopdoor = IS_DOOR(loc->typ) && *in_rooms(level, x, y, SHOPBASE);
	oldobjs = level->objects[x][y];
	ttmp = maketrap(level, x, y, ttyp);
	if (!ttmp) return;
	newobjs = level->objects[x][y];
	ttmp->tseen = (madeby_u || cansee(x,y));
	ttmp->madeby_u = madeby_u;
	newsym(ttmp->tx,ttmp->ty);

	if (ttyp == PIT) {

	    if (madeby_u) {
		pline("You dig a pit in the %s.", surface_type);
		if (shopdoor) pay_for_damage("ruin", FALSE);
	    } else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a pit in the %s.", Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A pit appears in the %s.", surface_type);

	    if (at_u) {
		if (!wont_fall) {
		    if (!Passes_walls)
			u.utrap = rn1(4,2);
		    u.utraptype = TT_PIT;
		    vision_full_recalc = 1;	/* vision limits change */
		} else
		    u.utrap = 0;
		if (oldobjs != newobjs)	/* something unearthed */
			pickup(1);	/* detects pit */
	    } else if (mtmp) {
		if (is_flyer(mtmp->data) || is_floater(mtmp->data)) {
		    if (canseemon(level, mtmp))
			pline("%s %s over the pit.", Monnam(mtmp),
						     (is_flyer(mtmp->data)) ?
						     "flies" : "floats");
		} else if (mtmp != madeby)
		    mintrap(mtmp);
	    }
	} else {	/* was TRAPDOOR now a HOLE*/

	    if (madeby_u)
		pline("You dig a hole through the %s.", surface_type);
	    else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a hole through the %s.",
		      Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A hole appears in the %s.", surface_type);

	    if (at_u) {
		if (!u.ustuck && !wont_fall && !next_to_u()) {
		    pline("You are jerked back by your pet!");
		    wont_fall = TRUE;
		}

		/* Floor objects get a chance of falling down.  The case where
		 * the hero does NOT fall down is treated here.  The case
		 * where the hero does fall down is treated in goto_level().
		 */
		if (u.ustuck || wont_fall) {
		    if (newobjs)
			impact_drop(NULL, x, y, 0);
		    if (oldobjs != newobjs)
			pickup(1);
		    if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);

		} else {
		    d_level newlevel;

		    if (*u.ushops && madeby_u)
			shopdig(1); /* shk might snatch pack */
		    /* handle earlier damage, eg breaking wand of digging */
		    else if (!madeby_u) pay_for_damage("dig into", TRUE);

		    pline("You fall through...");
		    /* Earlier checks must ensure that the destination
		     * level exists and is in the present dungeon.
		     */
		    newlevel.dnum = u.uz.dnum;
		    newlevel.dlevel = u.uz.dlevel + 1;
		    goto_level(&newlevel, FALSE, TRUE, FALSE);
		    /* messages for arriving in special rooms */
		    spoteffects(FALSE);
		}
	    } else {
		if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);
		if (newobjs)
		    impact_drop(NULL, x, y, 0);
		if (mtmp) {
		     /*[don't we need special sokoban handling here?]*/
		    if (is_flyer(mtmp->data) || is_floater(mtmp->data) ||
		        mtmp->data == &mons[PM_WUMPUS] ||
			(mtmp->wormno && count_wsegs(mtmp) > 5) ||
			mtmp->data->msize >= MZ_HUGE) return;
		    if (mtmp == u.ustuck)	/* probably a vortex */
			    return;		/* temporary? kludge */

		    if (teleport_pet(mtmp, FALSE)) {
			d_level tolevel;

			if (Is_stronghold(&u.uz)) {
			    assign_level(&tolevel, &valley_level);
			} else if (Is_botlevel(&u.uz)) {
			    if (canseemon(level, mtmp))
				pline("%s avoids the trap.", Monnam(mtmp));
			    return;
			} else {
			    get_level(&tolevel, depth(&u.uz) + 1);
			}
			if (mtmp->isshk) make_angry_shk(mtmp, 0, 0);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
		    }
		}
	    }
	}
}